

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O0

ssize_t __thiscall
nanovdb::io::GridMetaData::read(GridMetaData *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  pointer pcVar2;
  runtime_error *this_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  long *plVar3;
  unique_ptr<char[],_std::default_delete<char[]>_> tmp;
  char *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  std::istream::read((char *)plVar3,(long)this);
  operator_new__((ulong)(this->super_MetaData).nameSize);
  std::unique_ptr<char[],std::default_delete<char[]>>::
  unique_ptr<char*,std::default_delete<char[]>,void,bool>
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)
                      CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  std::istream::read((char *)plVar3,(long)pcVar2);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::get
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  std::__cxx11::string::assign((char *)&this->gridName);
  bVar1 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)
               CONCAT17(bVar1,in_stack_ffffffffffffffb0));
    return extraout_RAX;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Failed reading GridMetaData");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void GridMetaData::read(std::istream& is)
{
    is.read(reinterpret_cast<char*>(this), sizeof(MetaData));
    std::unique_ptr<char[]> tmp(new char[nameSize]);
    is.read(reinterpret_cast<char*>(tmp.get()), nameSize);
    gridName.assign(tmp.get());
    if (!is)
        throw std::runtime_error("Failed reading GridMetaData");
}